

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cc
# Opt level: O1

Metadata * __thiscall draco::Metadata::sub_metadata(Metadata *this,string *name)

{
  iterator iVar1;
  Metadata *pMVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
          ::find(&(this->sub_metadatas_)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->sub_metadatas_)._M_t._M_impl.super__Rb_tree_header
     ) {
    pMVar2 = (Metadata *)0x0;
  }
  else {
    pMVar2 = *(Metadata **)(iVar1._M_node + 2);
  }
  return pMVar2;
}

Assistant:

Metadata *Metadata::sub_metadata(const std::string &name) {
  auto sub_ptr = sub_metadatas_.find(name);
  if (sub_ptr == sub_metadatas_.end()) {
    return nullptr;
  }
  return sub_ptr->second.get();
}